

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXNodeAttribute.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::NodeAttribute::NodeAttribute
          (NodeAttribute *this,uint64_t id,Element *element,Document *doc,string *name)

{
  string *doc_00;
  int iVar1;
  Token *this_00;
  char *pcVar2;
  Token *t;
  byte local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_88;
  byte local_71;
  undefined1 local_70 [7];
  bool is_null_or_limb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string *classname;
  Scope *local_38;
  Scope *sc;
  string *name_local;
  Document *doc_local;
  Element *element_local;
  uint64_t id_local;
  NodeAttribute *this_local;
  
  sc = (Scope *)name;
  name_local = (string *)doc;
  doc_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  FBX::Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__NodeAttribute_00faf3b8;
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr(&this->props);
  local_38 = GetRequiredScope((Element *)doc_local);
  this_00 = GetRequiredToken((Element *)doc_local,2);
  ParseTokenAsString_abi_cxx11_((string *)local_70,(FBX *)this_00,t);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(pcVar2,"Null");
  local_c9 = 1;
  if (iVar1 != 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar2,"LimbNode");
    local_c9 = iVar1 != 0 ^ 0xff;
  }
  doc_00 = name_local;
  local_71 = local_c9 & 1;
  std::operator+(&local_a8,"NodeAttribute.Fbx",local_50);
  Util::GetPropertyTable
            ((Util *)&local_88,(Document *)doc_00,&local_a8,(Element *)doc_local,local_38,
             (bool)(local_71 & 1));
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=(&this->props,&local_88);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

NodeAttribute::NodeAttribute(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
, props()
{
    const Scope& sc = GetRequiredScope(element);

    const std::string& classname = ParseTokenAsString(GetRequiredToken(element,2));

    // hack on the deriving type but Null/LimbNode attributes are the only case in which
    // the property table is by design absent and no warning should be generated
    // for it.
    const bool is_null_or_limb = !strcmp(classname.c_str(), "Null") || !strcmp(classname.c_str(), "LimbNode");
    props = GetPropertyTable(doc,"NodeAttribute.Fbx" + classname,element,sc, is_null_or_limb);
}